

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Gia_ManPrintMuxStats(Gia_Man_t *p)

{
  uint uVar1;
  int level;
  Gia_Man_t *pGVar2;
  int iVar3;
  double dVar4;
  uint local_30;
  uint local_2c;
  
  pGVar2 = p;
  if (p->pMuxes == (uint *)0x0) {
    Gia_ManCountMuxXor(p,(int *)&local_2c,(int *)&local_30);
    iVar3 = (~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - p->nBufs;
    uVar1 = iVar3 + (local_30 + local_2c) * -3;
  }
  else {
    local_30 = p->nXors;
    local_2c = p->nMuxes;
    uVar1 = (~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - (p->nBufs + local_30 + local_2c);
    iVar3 = (local_2c + local_30) * 3 + uVar1;
  }
  level = (int)pGVar2;
  Abc_Print(level,"stats:  ");
  dVar4 = (double)iVar3;
  Abc_Print(level,"xor =%8d %6.2f %%   ",((double)(int)local_30 * 300.0) / dVar4,(ulong)local_30);
  Abc_Print(level,"mux =%8d %6.2f %%   ",((double)(int)local_2c * 300.0) / dVar4,(ulong)local_2c);
  Abc_Print(level,"and =%8d %6.2f %%   ",((double)(int)uVar1 * 100.0) / dVar4,(ulong)uVar1);
  Abc_Print(level,"obj =%8d  ",
            (ulong)(uint)((~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - p->nBufs));
  fflush(_stdout);
}

Assistant:

void Gia_ManPrintMuxStats( Gia_Man_t * p )
{
    int nAnds, nMuxes, nXors, nTotal;
    if ( p->pMuxes )
    {
        nAnds  = Gia_ManAndNotBufNum(p)-Gia_ManXorNum(p)-Gia_ManMuxNum(p);
        nXors  = Gia_ManXorNum(p);
        nMuxes = Gia_ManMuxNum(p);
        nTotal = nAnds + 3*nXors + 3*nMuxes;
    }
    else 
    {
        Gia_ManCountMuxXor( p, &nMuxes, &nXors );
        nAnds  = Gia_ManAndNotBufNum(p) - 3*nMuxes - 3*nXors;
        nTotal = Gia_ManAndNotBufNum(p);
    }
    Abc_Print( 1, "stats:  " );
    Abc_Print( 1, "xor =%8d %6.2f %%   ", nXors,  300.0*nXors/nTotal );
    Abc_Print( 1, "mux =%8d %6.2f %%   ", nMuxes, 300.0*nMuxes/nTotal );
    Abc_Print( 1, "and =%8d %6.2f %%   ", nAnds,  100.0*nAnds/nTotal );
    Abc_Print( 1, "obj =%8d  ", Gia_ManAndNotBufNum(p) );
    fflush( stdout );
}